

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::ftranFT(HFactor *this,HVector *vector)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  iVar10 = vector->count;
  piVar2 = (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  piVar3 = (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (uint)(uVar8 >> 2);
  if (0 < (int)uVar9) {
    piVar4 = (vector->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      iVar1 = piVar2[uVar12];
      dVar13 = pdVar5[iVar1];
      lVar11 = (long)piVar3[uVar12];
      dVar14 = dVar13;
      if (piVar3[uVar12] < piVar3[uVar12 + 1]) {
        do {
          dVar14 = dVar14 - pdVar5[piVar6[lVar11]] * pdVar7[lVar11];
          lVar11 = lVar11 + 1;
        } while (piVar3[uVar12 + 1] != lVar11);
      }
      if ((((dVar13 != 0.0) || (NAN(dVar13))) || (dVar14 != 0.0)) || (NAN(dVar14))) {
        if ((dVar13 == 0.0) && (!NAN(dVar13))) {
          lVar11 = (long)iVar10;
          iVar10 = iVar10 + 1;
          piVar4[lVar11] = iVar1;
        }
        pdVar5[iVar1] =
             (double)(~-(ulong)(ABS(dVar14) < 1e-14) & (ulong)dVar14 |
                     -(ulong)(ABS(dVar14) < 1e-14) & 0x358dee7a4ad4b81f);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uVar9 & 0x7fffffff));
  }
  vector->count = iVar10;
  iVar10 = *(int *)((long)piVar3 + ((long)(uVar8 * 0x40000000) >> 0x1e));
  iVar1 = iVar10 * 5;
  dVar13 = (double)(int)(iVar1 + uVar9 * 0x14) + vector->synthetic_tick;
  if (iVar10 / (int)(uVar9 + 1) < 5) {
    dVar13 = dVar13 + (double)iVar1;
  }
  vector->synthetic_tick = dVar13;
  return;
}

Assistant:

void HFactor::ftranFT(HVector& vector) const {
  // Alias to non constant
  assert(vector.count >= 0);
  HighsInt rhs_count = vector.count;
  HighsInt* rhs_index = vector.index.data();
  double* rhs_array = vector.array.data();
  // Alias to PF buffer
  const HighsInt pf_pivot_count = pf_pivot_index.size();
  const HighsInt* pf_pivot_index = this->pf_pivot_index.data();
  const HighsInt* pf_start = this->pf_start.data();
  const HighsInt* pf_index = this->pf_index.data();
  const double* pf_value = this->pf_value.data();
  for (HighsInt i = 0; i < pf_pivot_count; i++) {
    HighsInt iRow = pf_pivot_index[i];
    double value0 = rhs_array[iRow];
    double value1 = value0;
    const HighsInt start = pf_start[i];
    const HighsInt end = pf_start[i + 1];
    for (HighsInt k = start; k < end; k++)
      value1 -= rhs_array[pf_index[k]] * pf_value[k];
    // This would skip the situation where they are both zeros
    if (value0 || value1) {
      if (value0 == 0) rhs_index[rhs_count++] = iRow;
      rhs_array[iRow] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }
  }
  // Save count back
  vector.count = rhs_count;
  vector.synthetic_tick += pf_pivot_count * 20 + pf_start[pf_pivot_count] * 5;
  if (pf_start[pf_pivot_count] / (pf_pivot_count + 1) < 5) {
    vector.synthetic_tick += pf_start[pf_pivot_count] * 5;
  }
}